

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.hpp
# Opt level: O0

lane<long_double> *
re::simd::lane_transform<long_double,re::simd::intrinsics::add<long_double>>
          (undefined8 param_1,undefined8 param_2,lane<long_double> *param_3)

{
  const_iterator pvVar1;
  const_iterator pvVar2;
  const_iterator pvVar3;
  iterator pvVar4;
  
  pvVar1 = std::cbegin<std::array<long_double,1ul>>((array<long_double,_1UL> *)0x10f10d);
  pvVar2 = std::cend<std::array<long_double,1ul>>((array<long_double,_1UL> *)0x10f11c);
  pvVar3 = std::cbegin<std::array<long_double,1ul>>((array<long_double,_1UL> *)0x10f12b);
  pvVar4 = std::begin<std::array<long_double,1ul>>((array<long_double,_1UL> *)0x10f13a);
  std::
  transform<long_double_const*,long_double_const*,long_double*,re::simd::intrinsics::add<long_double>>
            (pvVar1,pvVar2,pvVar3,pvVar4);
  return param_3;
}

Assistant:

lane<T>& lane_transform(
    lane<T> const& a,
    lane<T> const& b,
    lane<T>& output,
    BinaryOp op
) {
    std::transform(
        std::cbegin(a.a),
        std::cend(a.a),
        std::cbegin(b.a),
        std::begin(output.a),
        op
    );
    return output;
}